

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadLight(ColladaParser *this,Light *pLight)

{
  Assimp check_comma;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  Assimp *pAVar4;
  undefined1 check_comma_00;
  ulong in_RCX;
  char *pName;
  ai_real aVar5;
  ai_real local_54;
  ai_real local_50;
  ai_real local_4c;
  ai_real *local_48;
  ai_real *local_40;
  aiColor3D *local_38;
  
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar2 != '\0') {
    local_38 = &pLight->mColor;
    local_40 = &(pLight->mColor).g;
    local_48 = &(pLight->mColor).b;
    do {
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar2 == 1) {
        if (iVar3 != 1) {
LAB_0041d11a:
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"light");
        if (iVar2 == 0) {
          SkipElement(this);
        }
        else {
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) goto LAB_0041d11a;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar2 = strcmp((char *)CONCAT44(extraout_var_00,iVar2),"spot");
          if (iVar2 == 0) {
            pLight->mType = 3;
          }
          else {
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar2 != 1) goto LAB_0041d11a;
            iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar2 = strcmp((char *)CONCAT44(extraout_var_01,iVar2),"ambient");
            if (iVar2 == 0) {
              pLight->mType = 4;
            }
            else {
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar2 != 1) goto LAB_0041d11a;
              iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar2 = strcmp((char *)CONCAT44(extraout_var_02,iVar2),"directional");
              if (iVar2 == 0) {
                pLight->mType = 1;
              }
              else {
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                if (iVar2 != 1) goto LAB_0041d11a;
                iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar2 = strcmp((char *)CONCAT44(extraout_var_03,iVar2),"point");
                if (iVar2 == 0) {
                  pLight->mType = 2;
                }
                else {
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                  if (iVar2 != 1) goto LAB_0041d11a;
                  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                  iVar2 = strcmp((char *)CONCAT44(extraout_var_04,iVar2),"color");
                  check_comma_00 = (undefined1)in_RCX;
                  pName = "constant_attenuation";
                  if (iVar2 == 0) {
                    pAVar4 = (Assimp *)GetTextContent(this);
                    pAVar4 = (Assimp *)
                             fast_atoreal_move<float>
                                       (pAVar4,(char *)local_38,(float *)0x1,(bool)check_comma_00);
                    while( true ) {
                      check_comma = *pAVar4;
                      if ((0x20 < (ulong)(byte)check_comma) ||
                         ((0x100002600U >> ((ulong)(byte)check_comma & 0x3f) & 1) == 0)) break;
                      pAVar4 = pAVar4 + 1;
                    }
                    pAVar4 = (Assimp *)
                             fast_atoreal_move<float>
                                       (pAVar4,(char *)local_40,(float *)0x1,(bool)check_comma);
                    while( true ) {
                      in_RCX = (ulong)(byte)*pAVar4;
                      if ((0x20 < in_RCX) || ((0x100002600U >> (in_RCX & 0x3f) & 1) == 0)) break;
                      pAVar4 = pAVar4 + 1;
                    }
                    fast_atoreal_move<float>(pAVar4,(char *)local_48,(float *)0x1,(bool)*pAVar4);
                    pName = "color";
                  }
                  else {
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                    if (iVar2 != 1) goto LAB_0041d11a;
                    iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                    iVar2 = strcmp((char *)CONCAT44(extraout_var_05,iVar2),"constant_attenuation");
                    if (iVar2 == 0) {
                      pAVar4 = (Assimp *)GetTextContent(this);
                      local_54 = 0.0;
                      fast_atoreal_move<float>
                                (pAVar4,(char *)&local_54,(float *)0x1,SUB81(in_RCX,0));
                      pLight->mAttConstant = local_54;
                    }
                    else {
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                      if (iVar2 != 1) goto LAB_0041d11a;
                      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                      pName = "linear_attenuation";
                      iVar2 = strcmp((char *)CONCAT44(extraout_var_06,iVar2),"linear_attenuation");
                      if (iVar2 == 0) {
                        pAVar4 = (Assimp *)GetTextContent(this);
                        local_50 = 0.0;
                        fast_atoreal_move<float>
                                  (pAVar4,(char *)&local_50,(float *)0x1,SUB81(in_RCX,0));
                        pLight->mAttLinear = local_50;
                      }
                      else {
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                        if (iVar2 != 1) goto LAB_0041d11a;
                        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                        pName = "quadratic_attenuation";
                        iVar2 = strcmp((char *)CONCAT44(extraout_var_07,iVar2),
                                       "quadratic_attenuation");
                        if (iVar2 == 0) {
                          pAVar4 = (Assimp *)GetTextContent(this);
                          local_4c = 0.0;
                          fast_atoreal_move<float>
                                    (pAVar4,(char *)&local_4c,(float *)0x1,SUB81(in_RCX,0));
                          pLight->mAttQuadratic = local_4c;
                        }
                        else {
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
                          if (iVar2 != 1) goto LAB_0041d11a;
                          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                          pName = "falloff_angle";
                          iVar2 = strcmp((char *)CONCAT44(extraout_var_08,iVar2),"falloff_angle");
                          if (iVar2 == 0) {
LAB_0041d0b3:
                            aVar5 = ReadFloatFromTextContent(this);
                            pLight->mFalloffAngle = aVar5;
                          }
                          else {
                            pName = "falloff_exponent";
                            bVar1 = IsElement(this,"falloff_exponent");
                            if (bVar1) {
                              aVar5 = ReadFloatFromTextContent(this);
                              pLight->mFalloffExponent = aVar5;
                            }
                            else {
                              pName = "outer_cone";
                              bVar1 = IsElement(this,"outer_cone");
                              if (bVar1) {
LAB_0041d034:
                                aVar5 = ReadFloatFromTextContent(this);
                                pLight->mOuterAngle = aVar5;
                              }
                              else {
                                pName = "penumbra_angle";
                                bVar1 = IsElement(this,"penumbra_angle");
                                if (bVar1) {
                                  aVar5 = ReadFloatFromTextContent(this);
                                  pLight->mPenumbraAngle = aVar5;
                                }
                                else {
                                  pName = "intensity";
                                  bVar1 = IsElement(this,"intensity");
                                  if (bVar1) {
                                    aVar5 = ReadFloatFromTextContent(this);
                                    pLight->mIntensity = aVar5;
                                  }
                                  else {
                                    pName = "falloff";
                                    bVar1 = IsElement(this,"falloff");
                                    if (bVar1) goto LAB_0041d034;
                                    pName = "hotspot_beam";
                                    bVar1 = IsElement(this,"hotspot_beam");
                                    if (bVar1) goto LAB_0041d0b3;
                                    bVar1 = IsElement(this,"decay_falloff");
                                    if (!bVar1) goto LAB_0041d0cb;
                                    aVar5 = ReadFloatFromTextContent(this);
                                    pLight->mOuterAngle = aVar5;
                                    pName = "decay_falloff";
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  TestClosing(this,pName);
                }
              }
            }
          }
        }
      }
      else if (iVar3 == 2) {
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar2 = strcmp((char *)CONCAT44(extraout_var_09,iVar2),"light");
        if (iVar2 == 0) {
          return;
        }
      }
LAB_0041d0cb:
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar2 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadLight(Collada::Light& pLight)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("light")) {
                SkipElement();
            }
            else if (IsElement("spot")) {
                pLight.mType = aiLightSource_SPOT;
            }
            else if (IsElement("ambient")) {
                pLight.mType = aiLightSource_AMBIENT;
            }
            else if (IsElement("directional")) {
                pLight.mType = aiLightSource_DIRECTIONAL;
            }
            else if (IsElement("point")) {
                pLight.mType = aiLightSource_POINT;
            }
            else if (IsElement("color")) {
                // text content contains 3 floats
                const char* content = GetTextContent();

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.r);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.g);
                SkipSpacesAndLineEnd(&content);

                content = fast_atoreal_move<ai_real>(content, (ai_real&)pLight.mColor.b);
                SkipSpacesAndLineEnd(&content);

                TestClosing("color");
            }
            else if (IsElement("constant_attenuation")) {
                pLight.mAttConstant = ReadFloatFromTextContent();
                TestClosing("constant_attenuation");
            }
            else if (IsElement("linear_attenuation")) {
                pLight.mAttLinear = ReadFloatFromTextContent();
                TestClosing("linear_attenuation");
            }
            else if (IsElement("quadratic_attenuation")) {
                pLight.mAttQuadratic = ReadFloatFromTextContent();
                TestClosing("quadratic_attenuation");
            }
            else if (IsElement("falloff_angle")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("falloff_angle");
            }
            else if (IsElement("falloff_exponent")) {
                pLight.mFalloffExponent = ReadFloatFromTextContent();
                TestClosing("falloff_exponent");
            }
            // FCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("outer_cone")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("outer_cone");
            }
            // ... and this one is even deprecated
            else if (IsElement("penumbra_angle")) {
                pLight.mPenumbraAngle = ReadFloatFromTextContent();
                TestClosing("penumbra_angle");
            }
            else if (IsElement("intensity")) {
                pLight.mIntensity = ReadFloatFromTextContent();
                TestClosing("intensity");
            }
            else if (IsElement("falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("falloff");
            }
            else if (IsElement("hotspot_beam")) {
                pLight.mFalloffAngle = ReadFloatFromTextContent();
                TestClosing("hotspot_beam");
            }
            // OpenCOLLADA extensions
            // -------------------------------------------------------
            else if (IsElement("decay_falloff")) {
                pLight.mOuterAngle = ReadFloatFromTextContent();
                TestClosing("decay_falloff");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "light") == 0)
                break;
        }
    }
}